

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O0

void test_xonly_pubkey_comparison(void)

{
  int iVar1;
  int ecount;
  secp256k1_xonly_pubkey pk2;
  secp256k1_xonly_pubkey pk1;
  uchar pk2_ser [32];
  uchar pk1_ser [32];
  int *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff30;
  int iVar2;
  undefined1 local_88 [8];
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff80;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffff88;
  secp256k1_context *in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffffa8;
  secp256k1_xonly_pubkey *in_stack_ffffffffffffffb0;
  secp256k1_context *ctx;
  
  ctx = (secp256k1_context *)0x13c8f59870e36de;
  iVar2 = 0;
  set_counting_callbacks
            ((secp256k1_context *)(ulong)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  iVar1 = secp256k1_xonly_pubkey_parse(ctx,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x92,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_parse(ctx,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x93,"test condition failed: secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x95,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0");
    abort();
  }
  if (iVar2 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x96,"test condition failed: ecount == 1");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x97,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x98,"test condition failed: ecount == 2");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x99,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x9a,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x9b,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x9c,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk2) == 0");
    abort();
  }
  if (iVar2 != 2) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x9d,"test condition failed: ecount == 2");
    abort();
  }
  memset(local_88,0,0x40);
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (-1 < iVar1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0x9f,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0");
    abort();
  }
  if (iVar2 != 3) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xa0,"test condition failed: ecount == 3");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xa1,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0");
    abort();
  }
  if (iVar2 != 5) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xa2,"test condition failed: ecount == 5");
    abort();
  }
  iVar1 = secp256k1_xonly_pubkey_cmp
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  if (iVar1 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xa3,"test condition failed: secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0");
    abort();
  }
  if (iVar2 != 6) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/tests_impl.h"
            ,0xa4,"test condition failed: ecount == 6");
    abort();
  }
  return;
}

Assistant:

static void test_xonly_pubkey_comparison(void) {
    unsigned char pk1_ser[32] = {
        0x58, 0x84, 0xb3, 0xa2, 0x4b, 0x97, 0x37, 0x88, 0x92, 0x38, 0xa6, 0x26, 0x62, 0x52, 0x35, 0x11,
        0xd0, 0x9a, 0xa1, 0x1b, 0x80, 0x0b, 0x5e, 0x93, 0x80, 0x26, 0x11, 0xef, 0x67, 0x4b, 0xd9, 0x23
    };
    const unsigned char pk2_ser[32] = {
        0xde, 0x36, 0x0e, 0x87, 0x59, 0x8f, 0x3c, 0x01, 0x36, 0x2a, 0x2a, 0xb8, 0xc6, 0xf4, 0x5e, 0x4d,
        0xb2, 0xc2, 0xd5, 0x03, 0xa7, 0xf9, 0xf1, 0x4f, 0xa8, 0xfa, 0x95, 0xa8, 0xe9, 0x69, 0x76, 0x1c
    };
    secp256k1_xonly_pubkey pk1;
    secp256k1_xonly_pubkey pk2;
    int ecount = 0;

    set_counting_callbacks(CTX, &ecount);

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk1, pk1_ser) == 1);
    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk2, pk2_ser) == 1);

    CHECK(secp256k1_xonly_pubkey_cmp(CTX, NULL, &pk2) < 0);
    CHECK(ecount == 1);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, NULL) > 0);
    CHECK(ecount == 2);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk2) == 0);
    CHECK(ecount == 2);
    memset(&pk1, 0, sizeof(pk1)); /* illegal pubkey */
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk2) < 0);
    CHECK(ecount == 3);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk1, &pk1) == 0);
    CHECK(ecount == 5);
    CHECK(secp256k1_xonly_pubkey_cmp(CTX, &pk2, &pk1) > 0);
    CHECK(ecount == 6);
}